

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

StkId luaF_close(lua_State *L,StkId level,int status,int yy)

{
  long lVar1;
  StkId level_00;
  StkId tbc;
  ptrdiff_t levelrel;
  int yy_local;
  int status_local;
  StkId level_local;
  lua_State *L_local;
  
  lVar1 = (L->stack).offset;
  luaF_closeupval(L,level);
  _yy_local = level;
  while (_yy_local <= (L->tbclist).p) {
    level_00 = (L->tbclist).p;
    poptbclist(L);
    prepcallclosemth(L,level_00,status,yy);
    _yy_local = (StkId)((long)(L->stack).p + ((long)level - lVar1));
  }
  return _yy_local;
}

Assistant:

StkId luaF_close (lua_State *L, StkId level, int status, int yy) {
  ptrdiff_t levelrel = savestack(L, level);
  luaF_closeupval(L, level);  /* first, close the upvalues */
  while (L->tbclist.p >= level) {  /* traverse tbc's down to that level */
    StkId tbc = L->tbclist.p;  /* get variable index */
    poptbclist(L);  /* remove it from list */
    prepcallclosemth(L, tbc, status, yy);  /* close variable */
    level = restorestack(L, levelrel);
  }
  return level;
}